

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O3

uint32_t helper_usub8_arm(uint32_t a,uint32_t b,void *gep)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar2 = (a & 0xff) - (b & 0xff);
  uVar4 = (a >> 8 & 0xff) - (b >> 8 & 0xff);
  uVar6 = (uVar2 < 0x100) + 2;
  if (0xff < uVar4) {
    uVar6 = (uint)(uVar2 < 0x100);
  }
  uVar5 = (a >> 0x10 & 0xff) - (b >> 0x10 & 0xff);
  uVar1 = uVar6 + 4;
  if (0xff < uVar5) {
    uVar1 = uVar6;
  }
  uVar3 = (a >> 0x18) - (b >> 0x18);
  uVar6 = uVar1 + 8;
  if (0xff < uVar3) {
    uVar6 = uVar1;
  }
  *(uint *)gep = uVar6;
  return uVar2 & 0xff | uVar3 * 0x1000000 | (uVar4 & 0xff) << 8 | (uVar5 & 0xff) << 0x10;
}

Assistant:

uint32_t HELPER(glue(PFX,sub8))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    SUB8(a, b, 0);
    SUB8(a >> 8, b >> 8, 1);
    SUB8(a >> 16, b >> 16, 2);
    SUB8(a >> 24, b >> 24, 3);
    SET_GE;
    return res;
}